

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O1

uint32_t gravity_class_size(gravity_vm *vm,gravity_class_t *c)

{
  uint in_EAX;
  uint32_t uVar1;
  uint32_t uVar2;
  gravity_delegate_t *pgVar3;
  uint32_t hash_size;
  undefined8 uStack_28;
  
  (c->gc).visited = true;
  uVar2 = c->nivars;
  uStack_28._0_4_ = in_EAX;
  uVar1 = string_size(c->identifier);
  uVar1 = uVar2 * 0x10 + uVar1 + 0x78;
  uStack_28 = (ulong)(uint)uStack_28;
  gravity_hash_iterate2(c->htable,gravity_hash_internalsize,(void *)((long)&uStack_28 + 4),vm);
  uVar2 = gravity_hash_memsize(c->htable);
  uStack_28 = CONCAT44(uStack_28._4_4_ + uVar2,(uint)uStack_28);
  pgVar3 = gravity_vm_delegate(vm);
  if (((gravity_object_t *)c->xdata != (gravity_object_t *)0x0) &&
     (pgVar3->bridge_size != (gravity_bridge_size)0x0)) {
    uVar2 = (*pgVar3->bridge_size)(vm,(gravity_object_t *)c->xdata);
    uVar1 = uVar1 + uVar2;
  }
  (c->gc).visited = false;
  return uVar1;
}

Assistant:

uint32_t gravity_class_size (gravity_vm *vm, gravity_class_t *c) {
    SET_OBJECT_VISITED_FLAG(c, true);
    
    uint32_t class_size = sizeof(gravity_class_t) + (c->nivars * sizeof(gravity_value_t)) + string_size(c->identifier);

    uint32_t hash_size = 0;
    gravity_hash_iterate2(c->htable, gravity_hash_internalsize, (void *)&hash_size, (void *)vm);
    hash_size += gravity_hash_memsize(c->htable);

    gravity_delegate_t *delegate = gravity_vm_delegate(vm);
    if (c->xdata && delegate->bridge_size)
        class_size += delegate->bridge_size(vm, c->xdata);

    SET_OBJECT_VISITED_FLAG(c, false);
    return class_size;
}